

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS
ref_node_dratio_dnode0
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio,REF_DBL *d_ratio)

{
  REF_NODE ref_node_00;
  REF_DBL *pRVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  REF_DBL *pRVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  REF_DBL d_ratio1 [3];
  REF_DBL d_ratio0 [3];
  REF_DBL ratio1;
  REF_DBL ratio0;
  REF_DBL direction [3];
  REF_DBL m [6];
  REF_DBL d_r [3];
  undefined8 local_188;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined8 local_178;
  undefined8 local_168;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined8 local_158;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  undefined8 local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  REF_DBL local_118;
  double local_108;
  double local_100;
  double local_f8;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  REF_DBL local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  double local_88;
  undefined8 uStack_80;
  REF_DBL local_78 [6];
  double adStack_48 [3];
  
  if (((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->max <= node1)) ||
      ((node1 < 0 || (ref_node->global[(uint)node0] < 0)))) || (ref_node->global[(uint)node1] < 0))
  {
    pcVar6 = "node invalid";
    uVar8 = 3;
    uVar4 = 0x5f0;
    goto LAB_00180c0e;
  }
  ref_node_00 = (REF_NODE)ref_node->real;
  uVar5 = (ulong)(uint)(node1 * 0xf);
  uVar8 = (ulong)(uint)(node0 * 0xf);
  local_108 = *(double *)(&ref_node_00->n + uVar5 * 2) - *(double *)(&ref_node_00->n + uVar8 * 2);
  local_100 = *(double *)(&ref_node_00->blank + uVar5 * 2) -
              *(double *)(&ref_node_00->blank + uVar8 * 2);
  local_f8 = (double)(&ref_node_00->global)[uVar5] - (double)(&ref_node_00->global)[uVar8];
  auVar13._0_8_ = SQRT(local_f8 * local_f8 + local_108 * local_108 + local_100 * local_100) * 1e+20;
  auVar13._8_8_ = local_108;
  auVar14._8_4_ = SUB84(local_108,0);
  auVar14._0_8_ = -auVar13._0_8_;
  auVar14._12_4_ = (uint)((ulong)local_108 >> 0x20) ^ 0x80000000;
  auVar14 = maxpd(auVar13,auVar14);
  dVar12 = auVar14._0_8_;
  if (auVar14._8_8_ < dVar12) {
    dVar11 = local_100;
    if (local_100 <= -local_100) {
      dVar11 = -local_100;
    }
    if (dVar11 < dVar12) {
      dVar11 = local_f8;
      if (local_f8 <= -local_f8) {
        dVar11 = -local_f8;
      }
      if (dVar11 < dVar12) {
        if (ref_node->ratio_method == 2) {
          uVar2 = ref_node_dratio_dnode0_quadrature(ref_node_00,node0,node1,ratio,d_ratio);
          if (uVar2 == 0) {
LAB_00180eec:
            uVar8 = 0;
            goto LAB_00180c15;
          }
          uVar8 = (ulong)uVar2;
          pcVar6 = "dratio quad";
          uVar4 = 0x609;
        }
        else {
          lVar3 = 0;
          do {
            local_78[lVar3] =
                 *(REF_DBL *)(&ref_node_00->n + (long)(int)(node0 * 0xf + 3U + (int)lVar3) * 2);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 6);
          uVar2 = ref_matrix_sqrt_vt_m_v_deriv(local_78,&local_108,&local_130,(REF_DBL *)&local_168)
          ;
          if (uVar2 == 0) {
            lVar3 = 0;
            do {
              (&local_168)[lVar3] = (&local_168)[lVar3] ^ 0x8000000000000000;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
            pRVar1 = ref_node->real;
            lVar3 = 0;
            do {
              local_78[lVar3] = pRVar1[(int)((int)lVar3 + node1 * 0xf + 3U)];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 6);
            uVar2 = ref_matrix_sqrt_vt_m_v_deriv
                              (local_78,&local_108,&local_138,(REF_DBL *)&local_188);
            if (uVar2 == 0) {
              lVar3 = 0;
              do {
                (&local_188)[lVar3] = (&local_188)[lVar3] ^ 0x8000000000000000;
                lVar3 = lVar3 + 1;
              } while (lVar3 != 3);
              if ((1e-12 <= local_130) && (1e-12 <= local_138)) {
                pRVar7 = (REF_DBL *)&local_168;
                pRVar1 = (REF_DBL *)&local_188;
                if (local_130 < local_138) {
                  pRVar7 = (REF_DBL *)&local_188;
                  pRVar1 = (REF_DBL *)&local_168;
                }
                local_e8 = local_130;
                uStack_11c = uStack_15c;
                uStack_120 = uStack_160;
                local_128._4_4_ = local_168._4_4_;
                local_128._0_4_ = (undefined4)local_168;
                if (local_138 <= local_130) {
                  local_e8 = local_138;
                  uStack_11c = uStack_17c;
                  uStack_120 = uStack_180;
                  local_128._4_4_ = local_188._4_4_;
                  local_128._0_4_ = (undefined4)local_188;
                }
                local_118 = pRVar1[2];
                if (local_138 <= local_130) {
                  local_188._0_4_ = (undefined4)local_168;
                  local_188._4_4_ = local_168._4_4_;
                  uStack_180 = uStack_160;
                  uStack_17c = uStack_15c;
                }
                uVar9 = SUB84(local_138,0);
                uVar10 = (undefined4)((ulong)local_138 >> 0x20);
                if (local_138 <= local_130) {
                  uVar9 = SUB84(local_130,0);
                  uVar10 = (undefined4)((ulong)local_130 >> 0x20);
                }
                local_c8._0_4_ = (undefined4)local_188;
                local_c8._4_4_ = local_188._4_4_;
                uStack_c0 = uStack_180;
                uStack_bc = uStack_17c;
                local_b8 = pRVar7[2];
                lVar3 = 0;
                do {
                  adStack_48[lVar3] =
                       (((double)(&local_128)[lVar3] * (double)CONCAT44(uVar10,uVar9) +
                        (double)(&local_c8)[lVar3] * -local_e8) / (double)CONCAT44(uVar10,uVar9)) /
                       (double)CONCAT44(uVar10,uVar9);
                  lVar3 = lVar3 + 1;
                } while (lVar3 != 3);
                dVar12 = local_e8 / (double)CONCAT44(uVar10,uVar9);
                local_d8 = dVar12 + -1.0;
                uStack_d0 = 0;
                dVar11 = local_d8;
                if (local_d8 <= -local_d8) {
                  dVar11 = -local_d8;
                }
                if (1e-12 <= dVar11) {
                  uStack_e0 = 0;
                  dVar11 = log(dVar12);
                  local_148 = dVar11 * dVar12;
                  *ratio = (local_e8 * local_d8) / (dVar11 * dVar12);
                  local_a8._8_8_ = 0;
                  local_a8._0_8_ = dVar12 / dVar12;
                  local_98._8_4_ = (int)uStack_e0;
                  local_98._0_8_ = -(local_e8 * local_d8);
                  local_98._12_4_ = (uint)((ulong)uStack_e0 >> 0x20) ^ 0x80000000;
                  uVar8 = 0;
                  lVar3 = 0;
                  do {
                    local_140 = adStack_48[lVar3];
                    local_88 = local_e8 * adStack_48[lVar3] + (double)(&local_128)[lVar3] * local_d8
                    ;
                    uStack_80 = uStack_e0;
                    dVar11 = log(dVar12);
                    d_ratio[lVar3] =
                         ((local_88 * local_148 +
                          (local_140 * (double)local_a8._0_8_ + dVar11 * local_140) *
                          (double)local_98._0_8_) / local_148) / local_148;
                    lVar3 = lVar3 + 1;
                  } while (lVar3 != 3);
                }
                else {
                  *ratio = (local_130 + local_138) * 0.5;
                  uVar8 = 0;
                  lVar3 = 0;
                  do {
                    d_ratio[lVar3] =
                         ((double)(&local_128)[lVar3] + (double)(&local_c8)[lVar3]) * 0.5;
                    lVar3 = lVar3 + 1;
                  } while (lVar3 != 3);
                }
                goto LAB_00180c15;
              }
              if (local_138 <= local_130) {
                *ratio = local_138;
                *d_ratio = (REF_DBL)CONCAT44(local_188._4_4_,(undefined4)local_188);
                d_ratio[1] = (REF_DBL)CONCAT44(uStack_17c,uStack_180);
                uVar9 = (undefined4)local_178;
                uVar10 = (undefined4)((ulong)local_178 >> 0x20);
              }
              else {
                *ratio = local_130;
                *d_ratio = (REF_DBL)CONCAT44(local_168._4_4_,(undefined4)local_168);
                d_ratio[1] = (REF_DBL)CONCAT44(uStack_15c,uStack_160);
                uVar9 = (undefined4)local_158;
                uVar10 = (undefined4)((ulong)local_158 >> 0x20);
              }
              d_ratio[2] = (REF_DBL)CONCAT44(uVar10,uVar9);
              goto LAB_00180eec;
            }
            uVar8 = (ulong)uVar2;
            pcVar6 = "vt m v0";
            uVar4 = 0x611;
          }
          else {
            uVar8 = (ulong)uVar2;
            pcVar6 = "vt m v0";
            uVar4 = 0x60e;
          }
        }
LAB_00180c0e:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               uVar4,"ref_node_dratio_dnode0",uVar8,pcVar6);
        goto LAB_00180c15;
      }
    }
  }
  uVar8 = 0;
  *ratio = 0.0;
  d_ratio[2] = 0.0;
  *d_ratio = 0.0;
  d_ratio[1] = 0.0;
LAB_00180c15:
  return (REF_STATUS)uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_node_dratio_dnode0(REF_NODE ref_node, REF_INT node0,
                                          REF_INT node1, REF_DBL *ratio,
                                          REF_DBL *d_ratio) {
  REF_DBL direction[3], length;
  REF_DBL ratio0, d_ratio0[3], ratio1, d_ratio1[3];
  REF_DBL r, d_r[3], r_min, d_r_min[3], r_max, d_r_max[3];
  REF_INT i;
  REF_DBL r_log_r;
  REF_DBL m[6];

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

  length = ref_math_dot(direction, direction);
  length = sqrt(length);

  if (!ref_math_divisible(direction[0], length) ||
      !ref_math_divisible(direction[1], length) ||
      !ref_math_divisible(direction[2], length)) {
    *ratio = 0.0;
    d_ratio[0] = 0.0;
    d_ratio[1] = 0.0;
    d_ratio[2] = 0.0;
    return REF_SUCCESS;
  }

  if (REF_NODE_RATIO_QUADRATURE == ref_node->ratio_method) {
    RSS(ref_node_dratio_dnode0_quadrature(ref_node, node0, node1, ratio,
                                          d_ratio),
        "dratio quad");
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get(ref_node, node0, m), "node0 m");
  RSS(ref_matrix_sqrt_vt_m_v_deriv(m, direction, &ratio0, d_ratio0), "vt m v0");
  for (i = 0; i < 3; i++) d_ratio0[i] = -d_ratio0[i]; /* node 0 is neg */
  RSS(ref_node_metric_get(ref_node, node1, m), "node1 m");
  RSS(ref_matrix_sqrt_vt_m_v_deriv(m, direction, &ratio1, d_ratio1), "vt m v0");
  for (i = 0; i < 3; i++) d_ratio1[i] = -d_ratio1[i]; /* node 0 is neg */

  /* Loseille Lohner IMR 18 (2009) pg 613 */
  /* Alauzet Finite Elements in Analysis and Design 46 (2010) pg 185 */

  if (ratio0 < 1.0e-12 || ratio1 < 1.0e-12) {
    if (ratio0 < ratio1) {
      *ratio = ratio0;
      d_ratio[0] = d_ratio0[0];
      d_ratio[1] = d_ratio0[1];
      d_ratio[2] = d_ratio0[2];
    } else {
      *ratio = ratio1;
      d_ratio[0] = d_ratio1[0];
      d_ratio[1] = d_ratio1[1];
      d_ratio[2] = d_ratio1[2];
    }
    return REF_SUCCESS;
  }

  if (ratio0 < ratio1) {
    r_min = ratio0;
    d_r_min[0] = d_ratio0[0];
    d_r_min[1] = d_ratio0[1];
    d_r_min[2] = d_ratio0[2];
    r_max = ratio1;
    d_r_max[0] = d_ratio1[0];
    d_r_max[1] = d_ratio1[1];
    d_r_max[2] = d_ratio1[2];
  } else {
    r_min = ratio1;
    d_r_min[0] = d_ratio1[0];
    d_r_min[1] = d_ratio1[1];
    d_r_min[2] = d_ratio1[2];
    r_max = ratio0;
    d_r_max[0] = d_ratio0[0];
    d_r_max[1] = d_ratio0[1];
    d_r_max[2] = d_ratio0[2];
  }

  r = r_min / r_max;
  for (i = 0; i < 3; i++)
    d_r[i] = (d_r_min[i] * r_max - r_min * d_r_max[i]) / r_max / r_max;

  if (ABS(r - 1.0) < 1.0e-12) {
    *ratio = 0.5 * (r_min + r_max);
    for (i = 0; i < 3; i++) d_ratio[i] = 0.5 * (d_r_min[i] + d_r_max[i]);
    return REF_SUCCESS;
  }

  r_log_r = r * log(r);
  *ratio = r_min * (r - 1.0) / r_log_r;

  for (i = 0; i < 3; i++)
    d_ratio[i] = ((r_min * d_r[i] + d_r_min[i] * (r - 1.0)) * r_log_r -
                  r_min * (r - 1.0) * (r * 1 / r * d_r[i] + d_r[i] * log(r))) /
                 r_log_r / r_log_r;

  return REF_SUCCESS;
}